

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCylinderShape.cpp
# Opt level: O1

cbtVector3 __thiscall
cbtCylinderShapeZ::localGetSupportingVertexWithoutMargin(cbtCylinderShapeZ *this,cbtVector3 *vec)

{
  cbtScalar cVar1;
  ulong uVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  cbtVector3 cVar10;
  
  fVar8 = (this->super_cbtCylinderShape).super_cbtConvexInternalShape.m_implicitShapeDimensions.
          m_floats[0];
  cVar1 = (this->super_cbtCylinderShape).super_cbtConvexInternalShape.m_implicitShapeDimensions.
          m_floats[2];
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(vec->m_floats[1] * vec->m_floats[1])),
                           ZEXT416((uint)vec->m_floats[0]),ZEXT416((uint)vec->m_floats[0]));
  auVar9 = ZEXT816(0);
  if (auVar6._0_4_ < 0.0) {
    fVar7 = sqrtf(auVar6._0_4_);
    auVar9 = ZEXT816(0) << 0x40;
  }
  else {
    auVar6 = vsqrtss_avx(auVar6,auVar6);
    fVar7 = auVar6._0_4_;
  }
  if ((fVar7 != 0.0) || (NAN(fVar7))) {
    fVar8 = fVar8 / fVar7;
    auVar9._8_4_ = 0x80000000;
    auVar9._0_8_ = 0x8000000080000000;
    auVar9._12_4_ = 0x80000000;
    auVar6 = vxorps_avx512vl(ZEXT416((uint)cVar1),auVar9);
    uVar3 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)vec->m_floats[2]),0xe);
    bVar4 = (bool)((byte)uVar3 & 1);
    iVar5 = (uint)bVar4 * auVar6._0_4_ + (uint)!bVar4 * (int)cVar1;
    auVar6 = vinsertps_avx(ZEXT416((uint)(fVar8 * vec->m_floats[0])),
                           ZEXT416((uint)(fVar8 * vec->m_floats[1])),0x10);
    uVar2 = auVar6._0_8_;
  }
  else {
    auVar6._8_4_ = 0x80000000;
    auVar6._0_8_ = 0x8000000080000000;
    auVar6._12_4_ = 0x80000000;
    auVar6 = vxorps_avx512vl(ZEXT416((uint)cVar1),auVar6);
    uVar3 = vcmpss_avx512f(auVar9,ZEXT416((uint)vec->m_floats[2]),0xe);
    bVar4 = (bool)((byte)uVar3 & 1);
    iVar5 = (uint)bVar4 * auVar6._0_4_ + (uint)!bVar4 * (int)cVar1;
    uVar2 = (ulong)(uint)fVar8;
  }
  cVar10.m_floats[2] = (cbtScalar)iVar5;
  cVar10.m_floats[0] = (cbtScalar)(int)uVar2;
  cVar10.m_floats[1] = (cbtScalar)(int)(uVar2 >> 0x20);
  cVar10.m_floats[3] = 0.0;
  return (cbtVector3)cVar10.m_floats;
}

Assistant:

cbtVector3 cbtCylinderShapeZ::localGetSupportingVertexWithoutMargin(const cbtVector3& vec) const
{
	return CylinderLocalSupportZ(getHalfExtentsWithoutMargin(), vec);
}